

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkReadNodeNames(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Ptr_t *__ptr;
  void **ppvVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  char Buffer [1000];
  char local_418 [1000];
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (Vec_Ptr_t *)0x0;
    printf("Cannot open node list \"%s\".\n",pFileName);
  }
  else {
    __ptr = (Vec_Ptr_t *)malloc(0x10);
    __ptr->nCap = 100;
    __ptr->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    __ptr->pArray = ppvVar3;
    pcVar4 = fgets(local_418,1000,__stream);
    while (pcVar4 != (char *)0x0) {
      pcVar4 = strtok(local_418," \n\r\t");
      while (pcVar4 != (char *)0x0) {
        pAVar5 = Abc_NtkFindNode(pNtk,pcVar4);
        if (pAVar5 == (Abc_Obj_t *)0x0) {
          printf("Cannot find node \"%s\".\n",pcVar4);
          if (__ptr->pArray != (void **)0x0) {
            free(__ptr->pArray);
            __ptr->pArray = (void **)0x0;
          }
          free(__ptr);
          fclose(__stream);
        }
        else {
          uVar1 = __ptr->nSize;
          uVar2 = __ptr->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (__ptr->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(__ptr->pArray,0x80);
              }
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar2 * 2;
              if (iVar6 <= (int)uVar2) goto LAB_002e1edd;
              if (__ptr->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar3 = (void **)realloc(__ptr->pArray,(ulong)uVar2 << 4);
              }
            }
            __ptr->pArray = ppvVar3;
            __ptr->nCap = iVar6;
          }
LAB_002e1edd:
          __ptr->nSize = uVar1 + 1;
          __ptr->pArray[(int)uVar1] = pAVar5;
          pcVar4 = strtok((char *)0x0," \n\r\t");
        }
        if (pAVar5 == (Abc_Obj_t *)0x0) {
          return (Vec_Ptr_t *)0x0;
        }
      }
      pcVar4 = fgets(local_418,1000,__stream);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Abc_NtkReadNodeNames( Abc_Ntk_t * pNtk, char * pFileName )
{
    char Buffer[1000];
    Vec_Ptr_t * vNodes = NULL;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open node list \"%s\".\n", pFileName );
        return NULL;
    }
    vNodes = Vec_PtrAlloc( 100 );
    while ( fgets(Buffer, 1000, pFile) != NULL ) 
    {
        char * pToken = strtok( Buffer, " \n\r\t" );
        while ( pToken )
        {
            Abc_Obj_t * pObj = Abc_NtkFindNode( pNtk, pToken );
            if ( pObj == NULL )
            {
                printf( "Cannot find node \"%s\".\n", pToken );
                Vec_PtrFree( vNodes );
                fclose( pFile );
                return NULL;
            }
            Vec_PtrPush( vNodes, pObj );
            pToken = strtok( NULL, " \n\r\t" );
        }
    }
    fclose( pFile );
    return vNodes;
}